

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_ModelComponentReference __thiscall
ONX_Model::FirstDimensionStyleFromFont
          (ONX_Model *this,ON_Font *font,double model_space_text_scale,bool bIgnoreSystemDimStyles)

{
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ON_ModelComponentReference OVar2;
  uint local_64;
  ON_Font *local_60;
  uint managed_font_sn;
  ON_Font *managed_font;
  bool bIgnoreSystemDimStyles_local;
  double model_space_text_scale_local;
  ON_Font *font_local;
  ONX_Model *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if ((ON_Font *)CONCAT71(in_register_00000011,bIgnoreSystemDimStyles) == (ON_Font *)0x0) {
    local_60 = (ON_Font *)0x0;
  }
  else {
    local_60 = ON_Font::ManagedFont
                         ((ON_Font *)CONCAT71(in_register_00000011,bIgnoreSystemDimStyles));
  }
  if (local_60 == (ON_Font *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = ON_Font::ManagedFontSerialNumber(local_60);
  }
  if (local_64 == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0x452,"","Invalid font parameter");
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    OVar2 = FirstDimensionStyleFromManagedFontSerialNumber
                      (this,(uint)font,model_space_text_scale,SUB41(local_64,0));
    _Var1._M_pi = OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::FirstDimensionStyleFromFont(
  const ON_Font* font,
  double model_space_text_scale,
  bool bIgnoreSystemDimStyles
  ) const
{
  const ON_Font* managed_font
    = (nullptr != font)
    ? font->ManagedFont()
    : nullptr;

  const unsigned int managed_font_sn
    = (nullptr != managed_font)
    ? managed_font->ManagedFontSerialNumber()
    : 0;

  if ( 0 == managed_font_sn )
  {
    ON_ERROR("Invalid font parameter");
    return ON_ModelComponentReference::Empty;
  }

  return FirstDimensionStyleFromManagedFontSerialNumber(managed_font_sn, model_space_text_scale, bIgnoreSystemDimStyles);
}